

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

string * __thiscall
upb::generator::FieldInitializer_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FieldDefPtr field,
          upb_MiniTableField *field64,upb_MiniTableField *field32)

{
  ushort uVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  Nonnull<char_*> pcVar4;
  upb_MiniTableField *field64_00;
  size_t in_R9;
  char *__s;
  string_view format;
  string local_1a8;
  upb_MiniTableField *local_188 [2];
  upb_MiniTableField local_178;
  string local_168;
  string local_148;
  long local_128;
  Nonnull<char_*> pcStack_120;
  char local_118 [32];
  long local_f8;
  Nonnull<char_*> local_f0;
  char local_e8 [32];
  long local_c8;
  Nonnull<char_*> pcStack_c0;
  char local_b8 [32];
  long local_98;
  Nonnull<char_*> pcStack_90;
  size_type local_88;
  pointer local_80;
  size_type local_78;
  pointer local_70;
  size_t local_68;
  upb_MiniTableField *local_60;
  long local_58;
  Nonnull<char_*> pcStack_50;
  size_type local_48;
  pointer local_40;
  
  field64_00 = field64;
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (*(uint32_t *)&(field.ptr_)->opts,local_b8);
  local_c8 = (long)pcVar4 - (long)local_b8;
  pcStack_c0 = local_b8;
  ArchDependentSize_abi_cxx11_
            (&local_148,(generator *)(ulong)field64->offset_dont_copy_me__upb_internal_use_only,
             (ulong)*(ushort *)((long)&(field.ptr_)->opts + 4),(int64_t)field64_00);
  _Var3._M_p = local_148._M_dataplus._M_p;
  ArchDependentSize_abi_cxx11_
            (&local_168,(generator *)(long)field64->presence,
             (long)*(short *)((long)&(field.ptr_)->opts + 6),(int64_t)field64_00);
  _Var2._M_p = local_168._M_dataplus._M_p;
  uVar1 = *(ushort *)&(field.ptr_)->resolved_features;
  if (uVar1 == 0xffff) {
    __s = "kUpb_NoSub";
  }
  else {
    pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer((uint)uVar1,local_e8);
    local_f8 = (long)pcVar4 - (long)local_e8;
    field64_00 = &local_178;
    local_188[0] = field64_00;
    local_f0 = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_188,local_e8,pcVar4);
    __s = (char *)local_188[0];
  }
  if ((upb_MiniTableField *)__s == (upb_MiniTableField *)0x0) {
    local_68 = 0;
    __s = (char *)0x0;
  }
  else {
    local_68 = strlen(__s);
  }
  pcVar4 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((uint)*(byte *)((long)&(field.ptr_)->resolved_features + 2),local_118);
  local_128 = (long)pcVar4 - (long)local_118;
  pcStack_120 = local_118;
  GetModeInit_abi_cxx11_
            (&local_1a8,(generator *)field64,(upb_MiniTableField *)field.ptr_,field64_00);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98 = local_c8;
  pcStack_90 = pcStack_c0;
  local_88 = local_148._M_string_length;
  local_80 = _Var3._M_p;
  local_78 = local_168._M_string_length;
  local_70 = _Var2._M_p;
  local_58 = local_128;
  pcStack_50 = pcStack_120;
  local_48 = local_1a8._M_string_length;
  local_40 = local_1a8._M_dataplus._M_p;
  format._M_str = (char *)&local_98;
  format._M_len = (size_t)"{$0, $1, $2, $3, $4, $5}";
  local_60 = (upb_MiniTableField *)__s;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x18,format,
             (Nullable<const_absl::string_view_*>)&DAT_00000006,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((uVar1 != 0xffff) && (local_188[0] != &local_178)) {
    operator_delete(local_188[0],local_178._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldInitializer(upb::FieldDefPtr field,
                             const upb_MiniTableField* field64,
                             const upb_MiniTableField* field32) {
  return absl::Substitute(
      "{$0, $1, $2, $3, $4, $5}", upb_MiniTableField_Number(field64),
      ArchDependentSize(field32->UPB_PRIVATE(offset),
                        field64->UPB_PRIVATE(offset)),
      ArchDependentSize(field32->presence, field64->presence),
      field64->UPB_PRIVATE(submsg_index) == kUpb_NoSub
          ? "kUpb_NoSub"
          : absl::StrCat(field64->UPB_PRIVATE(submsg_index)).c_str(),
      field64->UPB_PRIVATE(descriptortype), GetModeInit(field32, field64));
}